

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_CCtxParams_setParameter(ZSTD_CCtx_params *CCtxParams,ZSTD_cParameter param,int value)

{
  uint uVar1;
  int iVar2;
  uint in_EDX;
  int in_ESI;
  uint *in_RDI;
  size_t err_code_4;
  size_t err_code_3;
  size_t err_code_2;
  size_t err_code_1;
  ZSTD_paramSwitch_e lcm;
  ZSTD_dictAttachPref_e pref;
  size_t err_code;
  undefined4 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  ZSTD_cParameter cParam;
  ZSTD_cParameter in_stack_ffffffffffffffc0;
  uint local_18;
  ulong local_8;
  
  cParam = (ZSTD_cParameter)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  if (in_ESI == 10) {
    iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam);
    if (iVar2 == 0) {
      local_8 = 0xffffffffffffffd6;
    }
    else {
      *in_RDI = in_EDX;
      local_8 = (ulong)*in_RDI;
    }
  }
  else if (in_ESI == 100) {
    local_8 = ZSTD_cParam_clampBounds(cParam,(int *)CONCAT44(100,in_stack_ffffffffffffffb0));
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      if (in_EDX == 0) {
        in_RDI[0xb] = 3;
      }
      else {
        in_RDI[0xb] = in_EDX;
      }
      if ((int)in_RDI[0xb] < 0) {
        local_8 = 0;
      }
      else {
        local_8 = (ulong)(int)in_RDI[0xb];
      }
    }
  }
  else if (in_ESI == 0x65) {
    if ((in_EDX == 0) ||
       (iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam), iVar2 != 0)) {
      in_RDI[1] = in_EDX;
      local_8 = (ulong)in_RDI[1];
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0x66) {
    if ((in_EDX == 0) ||
       (iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam), iVar2 != 0)) {
      in_RDI[3] = in_EDX;
      local_8 = (ulong)in_RDI[3];
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0x67) {
    if ((in_EDX == 0) ||
       (iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam), iVar2 != 0)) {
      in_RDI[2] = in_EDX;
      local_8 = (ulong)in_RDI[2];
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0x68) {
    if ((in_EDX == 0) ||
       (iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam), iVar2 != 0)) {
      in_RDI[4] = in_EDX;
      local_8 = (ulong)(int)in_EDX;
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0x69) {
    if ((in_EDX == 0) ||
       (iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam), iVar2 != 0)) {
      in_RDI[5] = in_EDX;
      local_8 = (ulong)in_RDI[5];
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0x6a) {
    iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam);
    if (iVar2 == 0) {
      local_8 = 0xffffffffffffffd6;
    }
    else {
      in_RDI[6] = in_EDX;
      local_8 = (ulong)in_RDI[6];
    }
  }
  else if (in_ESI == 0x6b) {
    if ((in_EDX == 0) ||
       (iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam), iVar2 != 0)) {
      in_RDI[7] = in_EDX;
      local_8 = (ulong)in_RDI[7];
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0xa0) {
    iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam);
    if (iVar2 == 0) {
      local_8 = 0xffffffffffffffd6;
    }
    else {
      in_RDI[0x18] = in_EDX;
      local_8 = (ulong)in_RDI[0x18];
    }
  }
  else if (in_ESI == 0xa1) {
    if ((in_EDX == 0) ||
       (iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam), iVar2 != 0)) {
      in_RDI[0x19] = in_EDX;
      local_8 = (ulong)in_RDI[0x19];
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0xa2) {
    if ((in_EDX == 0) ||
       (iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam), iVar2 != 0)) {
      in_RDI[0x1b] = in_EDX;
      local_8 = (ulong)in_RDI[0x1b];
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0xa3) {
    if ((in_EDX == 0) ||
       (iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam), iVar2 != 0)) {
      in_RDI[0x1a] = in_EDX;
      local_8 = (ulong)in_RDI[0x1a];
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0xa4) {
    if ((in_EDX == 0) ||
       (iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam), iVar2 != 0)) {
      in_RDI[0x1c] = in_EDX;
      local_8 = (ulong)in_RDI[0x1c];
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 200) {
    in_RDI[8] = (uint)(in_EDX != 0);
    local_8 = (ulong)(int)in_RDI[8];
  }
  else if (in_ESI == 0xc9) {
    in_RDI[9] = (uint)(in_EDX != 0);
    local_8 = (ulong)(int)in_RDI[9];
  }
  else if (in_ESI == 0xca) {
    in_RDI[10] = (uint)((in_EDX != 0 ^ 0xffU) & 1);
    local_8 = (ulong)(int)(uint)((in_RDI[10] != 0 ^ 0xffU) & 1);
  }
  else if (in_ESI == 400) {
    local_8 = ZSTD_cParam_clampBounds(cParam,(int *)CONCAT44(400,in_stack_ffffffffffffffb0));
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      in_RDI[0x13] = in_EDX;
      local_8 = (ulong)(int)in_RDI[0x13];
    }
  }
  else if (in_ESI == 0x191) {
    local_18 = in_EDX;
    if ((in_EDX != 0) && ((int)in_EDX < 0x80000)) {
      local_18 = 0x80000;
    }
    local_8 = ZSTD_cParam_clampBounds(cParam,(int *)CONCAT44(0x191,in_stack_ffffffffffffffb0));
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      if ((int)local_18 < 0) {
        __assert_fail("value >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x542c,
                      "size_t ZSTD_CCtxParams_setParameter(ZSTD_CCtx_params *, ZSTD_cParameter, int)"
                     );
      }
      *(long *)(in_RDI + 0x14) = (long)(int)local_18;
      local_8 = *(ulong *)(in_RDI + 0x14);
    }
  }
  else if (in_ESI == 0x192) {
    local_8 = ZSTD_cParam_clampBounds(cParam,(int *)CONCAT44(0x192,in_stack_ffffffffffffffb0));
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      in_RDI[0x16] = in_EDX;
      local_8 = (ulong)(int)in_RDI[0x16];
    }
  }
  else if (in_ESI == 500) {
    local_8 = ZSTD_cParam_clampBounds(cParam,(int *)CONCAT44(500,in_stack_ffffffffffffffb0));
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      in_RDI[0x17] = in_EDX;
      local_8 = (ulong)(int)in_RDI[0x17];
    }
  }
  else if (in_ESI == 1000) {
    in_RDI[0xc] = (uint)(in_EDX != 0);
    local_8 = (ulong)(int)in_RDI[0xc];
  }
  else if (in_ESI == 0x3e9) {
    iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam);
    if (iVar2 == 0) {
      local_8 = 0xffffffffffffffd6;
    }
    else {
      in_RDI[0x11] = in_EDX;
      local_8 = (ulong)in_RDI[0x11];
    }
  }
  else if (in_ESI == 0x3ea) {
    iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam);
    if (iVar2 == 0) {
      local_8 = 0xffffffffffffffd6;
    }
    else {
      in_RDI[0x12] = in_EDX;
      local_8 = (ulong)in_RDI[0x12];
    }
  }
  else if (in_ESI == 0x3eb) {
    if ((in_EDX == 0) ||
       (iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam), iVar2 != 0)) {
      *(ulong *)(in_RDI + 0xe) = (ulong)in_EDX;
      local_8 = *(ulong *)(in_RDI + 0xe);
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0x3ec) {
    if ((in_EDX == 0) ||
       (iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam), iVar2 != 0)) {
      in_RDI[0x10] = in_EDX;
      local_8 = (ulong)(int)in_RDI[0x10];
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0x3ed) {
    in_RDI[0x1e] = (uint)(in_EDX != 0);
    local_8 = (ulong)(int)in_RDI[0x1e];
  }
  else if (in_ESI == 0x3ee) {
    iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam);
    if (iVar2 == 0) {
      local_8 = 0xffffffffffffffd6;
    }
    else {
      in_RDI[0x1f] = in_EDX;
      local_8 = (ulong)in_RDI[0x1f];
    }
  }
  else if (in_ESI == 0x3ef) {
    iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam);
    if (iVar2 == 0) {
      local_8 = 0xffffffffffffffd6;
    }
    else {
      in_RDI[0x20] = in_EDX;
      local_8 = (ulong)in_RDI[0x20];
    }
  }
  else if (in_ESI == 0x3f0) {
    iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam);
    if (iVar2 == 0) {
      local_8 = 0xffffffffffffffd6;
    }
    else {
      in_RDI[0x21] = in_EDX;
      local_8 = (ulong)in_RDI[0x21];
    }
  }
  else if (in_ESI == 0x3f1) {
    iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam);
    if (iVar2 == 0) {
      local_8 = 0xffffffffffffffd6;
    }
    else {
      in_RDI[0x22] = in_EDX;
      local_8 = (ulong)(int)in_RDI[0x22];
    }
  }
  else if (in_ESI == 0x3f2) {
    iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam);
    if (iVar2 == 0) {
      local_8 = 0xffffffffffffffd6;
    }
    else {
      in_RDI[0x23] = in_EDX;
      local_8 = (ulong)in_RDI[0x23];
    }
  }
  else if (in_ESI == 0x3f3) {
    iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam);
    if (iVar2 == 0) {
      local_8 = 0xffffffffffffffd6;
    }
    else {
      in_RDI[0x24] = in_EDX;
      local_8 = (ulong)in_RDI[0x24];
    }
  }
  else if (in_ESI == 0x3f4) {
    iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam);
    if (iVar2 == 0) {
      local_8 = 0xffffffffffffffd6;
    }
    else {
      in_RDI[0x25] = (uint)(in_EDX != 0);
      local_8 = (ulong)(int)in_RDI[0x25];
    }
  }
  else if (in_ESI == 0x3f5) {
    iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam);
    if (iVar2 == 0) {
      local_8 = 0xffffffffffffffd6;
    }
    else {
      in_RDI[0x2c] = in_EDX;
      local_8 = (ulong)in_RDI[0x2c];
    }
  }
  else if (in_ESI == 0x3f6) {
    iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam);
    if (iVar2 == 0) {
      local_8 = 0xffffffffffffffd6;
    }
    else {
      in_RDI[0x2d] = in_EDX;
      local_8 = (ulong)(int)in_RDI[0x2d];
    }
  }
  else if (in_ESI == 0x3f7) {
    if ((in_EDX == 0) ||
       (iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam), iVar2 != 0)) {
      *(long *)(in_RDI + 0x30) = (long)(int)in_EDX;
      local_8 = *(ulong *)(in_RDI + 0x30);
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0x3f8) {
    iVar2 = ZSTD_cParam_withinBounds(in_stack_ffffffffffffffc0,cParam);
    if (iVar2 == 0) {
      local_8 = 0xffffffffffffffd6;
    }
    else {
      in_RDI[0x32] = in_EDX;
      local_8 = (ulong)in_RDI[0x32];
    }
  }
  else {
    local_8 = 0xffffffffffffffd8;
  }
  return local_8;
}

Assistant:

size_t ZSTD_CCtxParams_setParameter(ZSTD_CCtx_params* CCtxParams,
                                    ZSTD_cParameter param, int value)
{
    DEBUGLOG(4, "ZSTD_CCtxParams_setParameter (%i, %i)", (int)param, value);
    switch(param)
    {
    case ZSTD_c_format :
        BOUNDCHECK(ZSTD_c_format, value);
        CCtxParams->format = (ZSTD_format_e)value;
        return (size_t)CCtxParams->format;

    case ZSTD_c_compressionLevel : {
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(param, &value), "");
        if (value == 0)
            CCtxParams->compressionLevel = ZSTD_CLEVEL_DEFAULT; /* 0 == default */
        else
            CCtxParams->compressionLevel = value;
        if (CCtxParams->compressionLevel >= 0) return (size_t)CCtxParams->compressionLevel;
        return 0;  /* return type (size_t) cannot represent negative values */
    }

    case ZSTD_c_windowLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_windowLog, value);
        CCtxParams->cParams.windowLog = (U32)value;
        return CCtxParams->cParams.windowLog;

    case ZSTD_c_hashLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_hashLog, value);
        CCtxParams->cParams.hashLog = (U32)value;
        return CCtxParams->cParams.hashLog;

    case ZSTD_c_chainLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_chainLog, value);
        CCtxParams->cParams.chainLog = (U32)value;
        return CCtxParams->cParams.chainLog;

    case ZSTD_c_searchLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_searchLog, value);
        CCtxParams->cParams.searchLog = (U32)value;
        return (size_t)value;

    case ZSTD_c_minMatch :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_minMatch, value);
        CCtxParams->cParams.minMatch = (U32)value;
        return CCtxParams->cParams.minMatch;

    case ZSTD_c_targetLength :
        BOUNDCHECK(ZSTD_c_targetLength, value);
        CCtxParams->cParams.targetLength = (U32)value;
        return CCtxParams->cParams.targetLength;

    case ZSTD_c_strategy :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_strategy, value);
        CCtxParams->cParams.strategy = (ZSTD_strategy)value;
        return (size_t)CCtxParams->cParams.strategy;

    case ZSTD_c_contentSizeFlag :
        /* Content size written in frame header _when known_ (default:1) */
        DEBUGLOG(4, "set content size flag = %u", (value!=0));
        CCtxParams->fParams.contentSizeFlag = value != 0;
        return (size_t)CCtxParams->fParams.contentSizeFlag;

    case ZSTD_c_checksumFlag :
        /* A 32-bits content checksum will be calculated and written at end of frame (default:0) */
        CCtxParams->fParams.checksumFlag = value != 0;
        return (size_t)CCtxParams->fParams.checksumFlag;

    case ZSTD_c_dictIDFlag : /* When applicable, dictionary's dictID is provided in frame header (default:1) */
        DEBUGLOG(4, "set dictIDFlag = %u", (value!=0));
        CCtxParams->fParams.noDictIDFlag = !value;
        return !CCtxParams->fParams.noDictIDFlag;

    case ZSTD_c_forceMaxWindow :
        CCtxParams->forceWindow = (value != 0);
        return (size_t)CCtxParams->forceWindow;

    case ZSTD_c_forceAttachDict : {
        const ZSTD_dictAttachPref_e pref = (ZSTD_dictAttachPref_e)value;
        BOUNDCHECK(ZSTD_c_forceAttachDict, (int)pref);
        CCtxParams->attachDictPref = pref;
        return CCtxParams->attachDictPref;
    }

    case ZSTD_c_literalCompressionMode : {
        const ZSTD_paramSwitch_e lcm = (ZSTD_paramSwitch_e)value;
        BOUNDCHECK(ZSTD_c_literalCompressionMode, (int)lcm);
        CCtxParams->literalCompressionMode = lcm;
        return CCtxParams->literalCompressionMode;
    }

    case ZSTD_c_nbWorkers :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR_IF(value!=0, parameter_unsupported, "not compiled with multithreading");
        return 0;
#else
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(param, &value), "");
        CCtxParams->nbWorkers = value;
        return CCtxParams->nbWorkers;
#endif

    case ZSTD_c_jobSize :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR_IF(value!=0, parameter_unsupported, "not compiled with multithreading");
        return 0;
#else
        /* Adjust to the minimum non-default value. */
        if (value != 0 && value < ZSTDMT_JOBSIZE_MIN)
            value = ZSTDMT_JOBSIZE_MIN;
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(param, &value), "");
        assert(value >= 0);
        CCtxParams->jobSize = value;
        return CCtxParams->jobSize;
#endif

    case ZSTD_c_overlapLog :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR_IF(value!=0, parameter_unsupported, "not compiled with multithreading");
        return 0;
#else
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(ZSTD_c_overlapLog, &value), "");
        CCtxParams->overlapLog = value;
        return CCtxParams->overlapLog;
#endif

    case ZSTD_c_rsyncable :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR_IF(value!=0, parameter_unsupported, "not compiled with multithreading");
        return 0;
#else
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(ZSTD_c_overlapLog, &value), "");
        CCtxParams->rsyncable = value;
        return CCtxParams->rsyncable;
#endif

    case ZSTD_c_enableDedicatedDictSearch :
        CCtxParams->enableDedicatedDictSearch = (value!=0);
        return (size_t)CCtxParams->enableDedicatedDictSearch;

    case ZSTD_c_enableLongDistanceMatching :
        BOUNDCHECK(ZSTD_c_enableLongDistanceMatching, value);
        CCtxParams->ldmParams.enableLdm = (ZSTD_paramSwitch_e)value;
        return CCtxParams->ldmParams.enableLdm;

    case ZSTD_c_ldmHashLog :
        if (value!=0)   /* 0 ==> auto */
            BOUNDCHECK(ZSTD_c_ldmHashLog, value);
        CCtxParams->ldmParams.hashLog = (U32)value;
        return CCtxParams->ldmParams.hashLog;

    case ZSTD_c_ldmMinMatch :
        if (value!=0)   /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_ldmMinMatch, value);
        CCtxParams->ldmParams.minMatchLength = (U32)value;
        return CCtxParams->ldmParams.minMatchLength;

    case ZSTD_c_ldmBucketSizeLog :
        if (value!=0)   /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_ldmBucketSizeLog, value);
        CCtxParams->ldmParams.bucketSizeLog = (U32)value;
        return CCtxParams->ldmParams.bucketSizeLog;

    case ZSTD_c_ldmHashRateLog :
        if (value!=0)   /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_ldmHashRateLog, value);
        CCtxParams->ldmParams.hashRateLog = (U32)value;
        return CCtxParams->ldmParams.hashRateLog;

    case ZSTD_c_targetCBlockSize :
        if (value!=0)   /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_targetCBlockSize, value);
        CCtxParams->targetCBlockSize = (U32)value;
        return CCtxParams->targetCBlockSize;

    case ZSTD_c_srcSizeHint :
        if (value!=0)    /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_srcSizeHint, value);
        CCtxParams->srcSizeHint = value;
        return (size_t)CCtxParams->srcSizeHint;

    case ZSTD_c_stableInBuffer:
        BOUNDCHECK(ZSTD_c_stableInBuffer, value);
        CCtxParams->inBufferMode = (ZSTD_bufferMode_e)value;
        return CCtxParams->inBufferMode;

    case ZSTD_c_stableOutBuffer:
        BOUNDCHECK(ZSTD_c_stableOutBuffer, value);
        CCtxParams->outBufferMode = (ZSTD_bufferMode_e)value;
        return CCtxParams->outBufferMode;

    case ZSTD_c_blockDelimiters:
        BOUNDCHECK(ZSTD_c_blockDelimiters, value);
        CCtxParams->blockDelimiters = (ZSTD_sequenceFormat_e)value;
        return CCtxParams->blockDelimiters;

    case ZSTD_c_validateSequences:
        BOUNDCHECK(ZSTD_c_validateSequences, value);
        CCtxParams->validateSequences = value;
        return CCtxParams->validateSequences;

    case ZSTD_c_useBlockSplitter:
        BOUNDCHECK(ZSTD_c_useBlockSplitter, value);
        CCtxParams->useBlockSplitter = (ZSTD_paramSwitch_e)value;
        return CCtxParams->useBlockSplitter;

    case ZSTD_c_useRowMatchFinder:
        BOUNDCHECK(ZSTD_c_useRowMatchFinder, value);
        CCtxParams->useRowMatchFinder = (ZSTD_paramSwitch_e)value;
        return CCtxParams->useRowMatchFinder;

    case ZSTD_c_deterministicRefPrefix:
        BOUNDCHECK(ZSTD_c_deterministicRefPrefix, value);
        CCtxParams->deterministicRefPrefix = !!value;
        return CCtxParams->deterministicRefPrefix;

    case ZSTD_c_prefetchCDictTables:
        BOUNDCHECK(ZSTD_c_prefetchCDictTables, value);
        CCtxParams->prefetchCDictTables = (ZSTD_paramSwitch_e)value;
        return CCtxParams->prefetchCDictTables;

    case ZSTD_c_enableSeqProducerFallback:
        BOUNDCHECK(ZSTD_c_enableSeqProducerFallback, value);
        CCtxParams->enableMatchFinderFallback = value;
        return CCtxParams->enableMatchFinderFallback;

    case ZSTD_c_maxBlockSize:
        if (value!=0)    /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_maxBlockSize, value);
        CCtxParams->maxBlockSize = value;
        return CCtxParams->maxBlockSize;

    case ZSTD_c_searchForExternalRepcodes:
        BOUNDCHECK(ZSTD_c_searchForExternalRepcodes, value);
        CCtxParams->searchForExternalRepcodes = (ZSTD_paramSwitch_e)value;
        return CCtxParams->searchForExternalRepcodes;

    default: RETURN_ERROR(parameter_unsupported, "unknown parameter");
    }
}